

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

void __thiscall QDialogButtonBoxPrivate::retranslateStrings(QDialogButtonBoxPrivate *this)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->standardButtonMap).c.keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.s;
  for (lVar3 = 0; lVar1 != lVar3; lVar3 = lVar3 + 1) {
    pvVar2 = (this->standardButtonMap).c.keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.ptr;
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x88))
              (&local_58,QGuiApplicationPrivate::platform_theme,
               *(undefined4 *)
                ((long)(this->standardButtonMap).c.values.
                       super_QVLABase<QDialogButtonBox::StandardButton>.super_QVLABaseBase.ptr +
                lVar3 * 4));
    if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
      QAbstractButton::setText(*(QAbstractButton **)((long)pvVar2 + lVar3 * 8),(QString *)&local_58)
      ;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::retranslateStrings()
{
    for (const auto &it : std::as_const(standardButtonMap)) {
        const QString text = QGuiApplicationPrivate::platformTheme()->standardButtonText(it.second);
        if (!text.isEmpty())
            it.first->setText(text);
    }
}